

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ItemSize(ImVec2 *size,float text_baseline_y)

{
  float fVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  float fVar4;
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  ImGuiContext *g;
  undefined1 in_register_00001204 [60];
  undefined1 auVar7 [64];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  pIVar6 = GImGui;
  auVar7._4_60_ = in_register_00001204;
  auVar7._0_4_ = text_baseline_y;
  pIVar3 = GImGui->CurrentWindow;
  if (pIVar3->SkipItems == false) {
    fVar8 = 0.0;
    if (0.0 <= text_baseline_y) {
      auVar9 = ZEXT416((uint)((pIVar3->DC).CurrLineTextBaseOffset - text_baseline_y));
      auVar5 = vcmpss_avx(auVar9,ZEXT816(0) << 0x40,2);
      auVar5 = vandnps_avx(auVar5,auVar9);
      fVar8 = auVar5._0_4_;
    }
    auVar9 = ZEXT416((uint)(fVar8 + size->y));
    auVar10 = ZEXT416((uint)(pIVar3->DC).CurrLineSize.y);
    auVar5 = vcmpss_avx(auVar9,auVar10,2);
    auVar5 = vblendvps_avx(auVar9,auVar10,auVar5);
    fVar4 = (pIVar3->DC).CursorPos.x + size->x;
    (pIVar3->DC).CursorPosPrevLine.x = fVar4;
    fVar8 = (pIVar3->DC).CursorPos.y;
    (pIVar3->DC).CursorPosPrevLine.y = fVar8;
    fVar1 = (pIVar6->Style).ItemSpacing.y;
    auVar9 = vinsertps_avx(ZEXT416((uint)(pIVar3->Pos).x),auVar5,0x10);
    auVar10 = vinsertps_avx(ZEXT416((uint)(pIVar3->DC).Indent.x),ZEXT416((uint)fVar8),0x10);
    auVar12 = vinsertps_avx(ZEXT416((uint)(pIVar3->DC).ColumnsOffset.x),ZEXT416((uint)fVar1),0x10);
    auVar11._0_4_ = (int)(auVar9._0_4_ + auVar10._0_4_ + auVar12._0_4_);
    auVar11._4_4_ = (int)(auVar9._4_4_ + auVar10._4_4_ + auVar12._4_4_);
    auVar11._8_4_ = (int)(auVar9._8_4_ + auVar10._8_4_ + auVar12._8_4_);
    auVar11._12_4_ = (int)(auVar9._12_4_ + auVar10._12_4_ + auVar12._12_4_);
    auVar9 = vcvtdq2ps_avx(auVar11);
    IVar2 = (ImVec2)vmovlps_avx(auVar9);
    (pIVar3->DC).CursorPos = IVar2;
    auVar9 = vmovshdup_avx(auVar9);
    auVar12._8_8_ = 0;
    auVar12._0_4_ = (pIVar3->DC).CursorMaxPos.x;
    auVar12._4_4_ = (pIVar3->DC).CursorMaxPos.y;
    auVar10 = vinsertps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)(auVar9._0_4_ - fVar1)),0x10);
    auVar9 = vcmpps_avx(auVar10,auVar12,2);
    auVar9 = vblendvps_avx(auVar10,auVar12,auVar9);
    IVar2 = (ImVec2)vmovlps_avx(auVar9);
    (pIVar3->DC).CursorMaxPos = IVar2;
    (pIVar3->DC).PrevLineSize.y = auVar5._0_4_;
    (pIVar3->DC).CurrLineSize.y = 0.0;
    auVar9 = ZEXT416((uint)(pIVar3->DC).CurrLineTextBaseOffset);
    auVar5 = vcmpss_avx(auVar7._0_16_,auVar9,2);
    auVar5 = vblendvps_avx(auVar7._0_16_,auVar9,auVar5);
    (pIVar3->DC).PrevLineTextBaseOffset = auVar5._0_4_;
    (pIVar3->DC).CurrLineTextBaseOffset = 0.0;
    if ((pIVar3->DC).LayoutType == 0) {
      pIVar3->WriteAccessed = true;
      (pIVar3->DC).CursorPos.x = fVar4 + (pIVar6->Style).ItemSpacing.x;
      (pIVar3->DC).CursorPos.y = fVar8;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = auVar5._0_4_;
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ItemSize(const ImVec2& size, float text_baseline_y)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // We increase the height in this function to accommodate for baseline offset.
    // In theory we should be offsetting the starting position (window->DC.CursorPos), that will be the topic of a larger refactor,
    // but since ItemSize() is not yet an API that moves the cursor (to handle e.g. wrapping) enlarging the height has the same effect.
    const float offset_to_match_baseline_y = (text_baseline_y >= 0) ? ImMax(0.0f, window->DC.CurrLineTextBaseOffset - text_baseline_y) : 0.0f;
    const float line_height = ImMax(window->DC.CurrLineSize.y, size.y + offset_to_match_baseline_y);

    // Always align ourselves on pixel boundaries
    //if (g.IO.KeyAlt) window->DrawList->AddRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(size.x, line_height), IM_COL32(255,0,0,200)); // [DEBUG]
    window->DC.CursorPosPrevLine.x = window->DC.CursorPos.x + size.x;
    window->DC.CursorPosPrevLine.y = window->DC.CursorPos.y;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);    // Next line
    window->DC.CursorPos.y = IM_FLOOR(window->DC.CursorPos.y + line_height + g.Style.ItemSpacing.y);        // Next line
    window->DC.CursorMaxPos.x = ImMax(window->DC.CursorMaxPos.x, window->DC.CursorPosPrevLine.x);
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, window->DC.CursorPos.y - g.Style.ItemSpacing.y);
    //if (g.IO.KeyAlt) window->DrawList->AddCircle(window->DC.CursorMaxPos, 3.0f, IM_COL32(255,0,0,255), 4); // [DEBUG]

    window->DC.PrevLineSize.y = line_height;
    window->DC.CurrLineSize.y = 0.0f;
    window->DC.PrevLineTextBaseOffset = ImMax(window->DC.CurrLineTextBaseOffset, text_baseline_y);
    window->DC.CurrLineTextBaseOffset = 0.0f;

    // Horizontal layout mode
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
        SameLine();
}